

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckMax
          (ShaderImageLoadStoreBase *this,GLenum pname,GLint min_value)

{
  CallLogWrapper *this_00;
  GLboolean b;
  GLint i;
  GLfloat f;
  GLint64 i64;
  GLdouble d;
  GLboolean local_39;
  int local_38;
  float local_34;
  int local_30 [2];
  double local_28;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,pname,&local_38);
  if ((((min_value <= local_38) &&
       (glu::CallLogWrapper::glGetBooleanv(this_00,pname,&local_39),
       (bool)local_39 == (local_38 != 0))) &&
      (glu::CallLogWrapper::glGetFloatv(this_00,pname,&local_34), min_value <= (int)local_34)) &&
     (glu::CallLogWrapper::glGetDoublev(this_00,pname,&local_28), min_value <= (int)local_28)) {
    glu::CallLogWrapper::glGetInteger64v(this_00,pname,(GLint64 *)local_30);
    return min_value <= local_30[0];
  }
  return false;
}

Assistant:

bool CheckMax(GLenum pname, GLint min_value)
	{
		GLboolean b;
		GLint	 i;
		GLfloat   f;
		GLdouble  d;
		GLint64   i64;

		glGetIntegerv(pname, &i);
		if (i < min_value)
			return false;

		glGetBooleanv(pname, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
			return false;

		glGetFloatv(pname, &f);
		if (static_cast<GLint>(f) < min_value)
			return false;

		glGetDoublev(pname, &d);
		if (static_cast<GLint>(d) < min_value)
			return false;

		glGetInteger64v(pname, &i64);
		if (static_cast<GLint>(i64) < min_value)
			return false;

		return true;
	}